

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  SrcList **ppSVar1;
  byte bVar2;
  u8 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  sqlite3 *db;
  SrcList *pSVar8;
  char *pcVar9;
  ExprList *pEVar10;
  Table *pTVar11;
  SrcList *pSVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  Select *pSVar17;
  SrcList *pSrc;
  Expr *pEVar18;
  Select *pSVar19;
  Parse *pPVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  int iVar26;
  int iVar27;
  Select *pSVar28;
  byte bVar29;
  int iVar31;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar51;
  int iVar54;
  undefined1 auVar52 [16];
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar58 [16];
  SubstContext x;
  Select *local_88;
  SubstContext local_50;
  
  bVar29 = 0;
  db = pParse->db;
  if ((db->dbOptFlags & 1) != 0) {
    return 0;
  }
  if (p->pWin != (Window *)0x0) {
    return 0;
  }
  pSVar8 = p->pSrc;
  lVar16 = (long)iFrom;
  pSVar28 = pSVar8->a[lVar16].pSelect;
  if (pSVar28->pWin != (Window *)0x0) {
    return 0;
  }
  pcVar9 = pParse->zAuthContext;
  iVar4 = pSVar8->a[lVar16].iCursor;
  pEVar18 = pSVar28->pLimit;
  if (pEVar18 == (Expr *)0x0) {
    uVar5 = p->selFlags;
  }
  else {
    if (p->pLimit != (Expr *)0x0) {
      return 0;
    }
    if (pEVar18->pRight != (Expr *)0x0) {
      return 0;
    }
    uVar5 = p->selFlags;
    if ((uVar5 >> 8 & 1) != 0) {
      return 0;
    }
  }
  iVar27 = pSVar28->pSrc->nSrc;
  if (iVar27 == 0) {
    return 0;
  }
  uVar6 = pSVar28->selFlags;
  if ((uVar6 & 1) != 0) {
    return 0;
  }
  if (pEVar18 != (Expr *)0x0) {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < pSVar8->nSrc) {
      return 0;
    }
  }
  pEVar10 = p->pOrderBy;
  if ((pEVar10 != (ExprList *)0x0) && (pSVar28->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if ((isAgg != 0) && (pSVar28->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if (pEVar18 == (Expr *)0x0) {
    if ((uVar6 >> 0xd & 1) != 0) {
      return 0;
    }
  }
  else {
    if (p->pWhere != (Expr *)0x0) {
      return 0;
    }
    if ((uVar6 & 0x2000) != 0 || (uVar5 & 1) != 0) {
      return 0;
    }
  }
  bVar2 = pSVar8->a[lVar16].fg.jointype;
  iVar26 = 0;
  if ((bVar2 & 0x20) != 0) {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < iVar27) {
      return 0;
    }
    if ((pSVar28->pSrc->a[0].pTab)->nModuleArg != 0) {
      return 0;
    }
    iVar26 = 1;
  }
  if (pSVar28->pPrior != (Select *)0x0) {
    if ((((uVar5 & 1) == 0 && isAgg == 0) && pSVar28->pOrderBy == (ExprList *)0x0) &&
       (pSVar19 = pSVar28, pSVar8->nSrc == 1)) {
      do {
        if (pSVar19 == (Select *)0x0) {
          if ((pEVar10 != (ExprList *)0x0) && (0 < (long)pEVar10->nExpr)) {
            lVar22 = 0;
            do {
              if (*(short *)((long)&pEVar10->a[0].u + lVar22) == 0) {
                return 0;
              }
              lVar22 = lVar22 + 0x20;
            } while ((long)pEVar10->nExpr * 0x20 != lVar22);
          }
          goto LAB_001a0450;
        }
        if ((pSVar19->selFlags & 9) != 0) {
          return 0;
        }
        if (pSVar19->pPrior != (Select *)0x0) {
          return 0;
        }
        ppSVar1 = &pSVar19->pSrc;
        pSVar19 = (Select *)0x0;
      } while (0 < (*ppSVar1)->nSrc);
    }
    return 0;
  }
LAB_001a0450:
  pParse->zAuthContext = pSVar8->a[lVar16].zName;
  sqlite3AuthCheck(pParse,0x15,(char *)0x0,(char *)0x0,(char *)0x0);
  pParse->zAuthContext = pcVar9;
  pSVar28 = pSVar28->pPrior;
  if (pSVar28 != (Select *)0x0) {
    pEVar10 = p->pOrderBy;
    pSVar19 = p->pPrior;
    pEVar18 = p->pLimit;
    do {
      p->pSrc = (SrcList *)0x0;
      p->pLimit = (Expr *)0x0;
      p->pOrderBy = (ExprList *)0x0;
      p->pPrior = (Select *)0x0;
      pSVar17 = sqlite3SelectDup(db,p,0);
      p->pLimit = pEVar18;
      p->pOrderBy = pEVar10;
      p->pSrc = pSVar8;
      p->op = 0x80;
      if (pSVar17 != (Select *)0x0) {
        pSVar17->pPrior = pSVar19;
        if (pSVar19 != (Select *)0x0) {
          pSVar19->pNext = pSVar17;
        }
        pSVar17->pNext = p;
        pSVar19 = pSVar17;
      }
      p->pPrior = pSVar19;
      if (db->mallocFailed != '\0') {
        return 1;
      }
      pSVar28 = pSVar28->pPrior;
    } while (pSVar28 != (Select *)0x0);
  }
  pcVar9 = pSVar8->a[lVar16].zDatabase;
  pSVar28 = pSVar8->a[lVar16].pSelect;
  if (pcVar9 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar9);
  }
  pcVar9 = pSVar8->a[lVar16].zName;
  if (pcVar9 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar9);
  }
  pcVar9 = pSVar8->a[lVar16].zAlias;
  if (pcVar9 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar9);
  }
  pSVar8->a[lVar16].pSelect = (Select *)0x0;
  pSVar8->a[lVar16].zAlias = (char *)0x0;
  pSVar8->a[lVar16].zDatabase = (char *)0x0;
  pSVar8->a[lVar16].zName = (char *)0x0;
  pTVar11 = pSVar8->a[lVar16].pTab;
  if (pTVar11 != (Table *)0x0) {
    if (pTVar11->nTabRef == 1) {
      pPVar20 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar20 = pParse;
      }
      pTVar11->pNextZombie = pPVar20->pZombieTab;
      pPVar20->pZombieTab = pTVar11;
    }
    else {
      pTVar11->nTabRef = pTVar11->nTabRef - 1;
    }
    pSVar8->a[lVar16].pTab = (Table *)0x0;
  }
  if (p != (Select *)0x0) {
    iVar27 = -1;
    local_88 = pSVar28;
    do {
      pSVar12 = local_88->pSrc;
      uVar5 = pSVar12->nSrc;
      uVar23 = (ulong)uVar5;
      pSrc = p->pSrc;
      if (pSrc == (SrcList *)0x0) {
        pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
        if (pSrc == (SrcList *)0x0) break;
        p->pSrc = pSrc;
        uVar3 = '\0';
      }
      else {
        uVar3 = pSVar8->a[lVar16].fg.jointype;
      }
      if ((int)uVar5 < 2) {
        if (uVar5 == 1) goto LAB_001a06a1;
      }
      else {
        pSrc = sqlite3SrcListEnlarge(pParse,pSrc,uVar5 - 1,iFrom + 1);
        if (pSrc == (SrcList *)0x0) break;
        p->pSrc = pSrc;
LAB_001a06a1:
        lVar22 = 8;
        do {
          sqlite3IdListDelete(db,*(IdList **)((long)&pSrc->a[lVar16].pOn + lVar22));
          puVar24 = (undefined8 *)((long)pSVar12->a + lVar22 + -8);
          puVar25 = (undefined8 *)((long)pSrc->a + lVar22 + lVar16 * 0x70 + -8);
          for (lVar21 = 0xe; lVar21 != 0; lVar21 = lVar21 + -1) {
            *puVar25 = *puVar24;
            puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
            puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
          }
          iVar27 = *(int *)((long)&pSVar12->a[0].regResult + lVar22);
          *(undefined1 (*) [16])((long)pSVar12->a + lVar22 + -8) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].zDatabase + lVar22) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].zAlias + lVar22) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].pSelect + lVar22) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].pOn + lVar22) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].colUsed + lVar22) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pSVar12->a[0].regResult + lVar22) = (undefined1  [16])0x0;
          lVar22 = lVar22 + 0x70;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      pSrc->a[lVar16].fg.jointype = uVar3;
      auVar15 = _DAT_001e5070;
      pEVar10 = local_88->pOrderBy;
      if (pEVar10 != (ExprList *)0x0) {
        iVar7 = pEVar10->nExpr;
        if (0 < (long)iVar7) {
          lVar22 = (long)iVar7 + -1;
          auVar30._8_4_ = (int)lVar22;
          auVar30._0_8_ = lVar22;
          auVar30._12_4_ = (int)((ulong)lVar22 >> 0x20);
          auVar30 = auVar30 ^ _DAT_001e5070;
          lVar22 = 0;
          auVar33 = _DAT_001e5060;
          auVar34 = _DAT_001e5050;
          auVar35 = _DAT_001e5040;
          auVar36 = _DAT_001e5030;
          do {
            auVar37 = auVar33 ^ auVar15;
            iVar51 = auVar30._0_4_;
            iVar50 = -(uint)(iVar51 < auVar37._0_4_);
            iVar31 = auVar30._4_4_;
            auVar38._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
            iVar55 = auVar30._8_4_;
            iVar54 = -(uint)(iVar55 < auVar37._8_4_);
            iVar32 = auVar30._12_4_;
            auVar38._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
            auVar47._4_4_ = iVar50;
            auVar47._0_4_ = iVar50;
            auVar47._8_4_ = iVar54;
            auVar47._12_4_ = iVar54;
            auVar56 = pshuflw(in_XMM8,auVar47,0xe8);
            auVar40._4_4_ = -(uint)(auVar37._4_4_ == iVar31);
            auVar40._12_4_ = -(uint)(auVar37._12_4_ == iVar32);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar58 = pshuflw(in_XMM9,auVar40,0xe8);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar57 = pshuflw(auVar56,auVar38,0xe8);
            auVar37._8_4_ = 0xffffffff;
            auVar37._0_8_ = 0xffffffffffffffff;
            auVar37._12_4_ = 0xffffffff;
            auVar37 = (auVar57 | auVar58 & auVar56) ^ auVar37;
            auVar37 = packssdw(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10->a[0].u + lVar22) = 0;
            }
            auVar38 = auVar40 & auVar47 | auVar38;
            auVar37 = packssdw(auVar38,auVar38);
            auVar57._8_4_ = 0xffffffff;
            auVar57._0_8_ = 0xffffffffffffffff;
            auVar57._12_4_ = 0xffffffff;
            auVar37 = packssdw(auVar37 ^ auVar57,auVar37 ^ auVar57);
            if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)&pEVar10[1].a[0].zSpan + lVar22 + 4) = 0;
            }
            auVar37 = auVar34 ^ auVar15;
            iVar50 = -(uint)(iVar51 < auVar37._0_4_);
            auVar52._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
            iVar54 = -(uint)(iVar55 < auVar37._8_4_);
            auVar52._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
            auVar39._4_4_ = iVar50;
            auVar39._0_4_ = iVar50;
            auVar39._8_4_ = iVar54;
            auVar39._12_4_ = iVar54;
            auVar46._4_4_ = -(uint)(auVar37._4_4_ == iVar31);
            auVar46._12_4_ = -(uint)(auVar37._12_4_ == iVar32);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar37 = auVar46 & auVar39 | auVar52;
            auVar37 = packssdw(auVar37,auVar37);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar37 = packssdw(auVar37 ^ auVar13,auVar37 ^ auVar13);
            if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10[2].a[0].zName + lVar22 + 4) = 0;
            }
            auVar40 = pshufhw(auVar39,auVar39,0x84);
            auVar47 = pshufhw(auVar46,auVar46,0x84);
            auVar38 = pshufhw(auVar40,auVar52,0x84);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar41 = (auVar38 | auVar47 & auVar40) ^ auVar41;
            auVar40 = packssdw(auVar41,auVar41);
            if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10[3].a[0].pExpr + lVar22 + 4) = 0;
            }
            auVar40 = auVar35 ^ auVar15;
            iVar50 = -(uint)(iVar51 < auVar40._0_4_);
            auVar43._4_4_ = -(uint)(iVar31 < auVar40._4_4_);
            iVar54 = -(uint)(iVar55 < auVar40._8_4_);
            auVar43._12_4_ = -(uint)(iVar32 < auVar40._12_4_);
            auVar48._4_4_ = iVar50;
            auVar48._0_4_ = iVar50;
            auVar48._8_4_ = iVar54;
            auVar48._12_4_ = iVar54;
            auVar37 = pshuflw(auVar37,auVar48,0xe8);
            auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar31);
            auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar32);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            in_XMM9 = pshuflw(auVar58 & auVar56,auVar42,0xe8);
            in_XMM9 = in_XMM9 & auVar37;
            auVar43._0_4_ = auVar43._4_4_;
            auVar43._8_4_ = auVar43._12_4_;
            auVar37 = pshuflw(auVar37,auVar43,0xe8);
            auVar56._8_4_ = 0xffffffff;
            auVar56._0_8_ = 0xffffffffffffffff;
            auVar56._12_4_ = 0xffffffff;
            auVar56 = (auVar37 | in_XMM9) ^ auVar56;
            auVar37 = packssdw(auVar56,auVar56);
            if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pEVar10[4].a + lVar22 + -4) = 0;
            }
            auVar43 = auVar42 & auVar48 | auVar43;
            auVar37 = packssdw(auVar43,auVar43);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar37 = packssdw(auVar37 ^ auVar58,auVar37 ^ auVar58);
            if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10[4].a[0].u + lVar22) = 0;
            }
            auVar37 = auVar36 ^ auVar15;
            iVar51 = -(uint)(iVar51 < auVar37._0_4_);
            auVar53._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
            iVar55 = -(uint)(iVar55 < auVar37._8_4_);
            auVar53._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
            auVar44._4_4_ = iVar51;
            auVar44._0_4_ = iVar51;
            auVar44._8_4_ = iVar55;
            auVar44._12_4_ = iVar55;
            auVar49._4_4_ = -(uint)(auVar37._4_4_ == iVar31);
            auVar49._12_4_ = -(uint)(auVar37._12_4_ == iVar32);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar37 = auVar49 & auVar44 | auVar53;
            auVar37 = packssdw(auVar37,auVar37);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar37 ^ auVar14,auVar37 ^ auVar14);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10[5].a[0].zSpan + lVar22 + 4) = 0;
            }
            auVar37 = pshufhw(auVar44,auVar44,0x84);
            auVar38 = pshufhw(auVar49,auVar49,0x84);
            auVar40 = pshufhw(auVar37,auVar53,0x84);
            auVar45._8_4_ = 0xffffffff;
            auVar45._0_8_ = 0xffffffffffffffff;
            auVar45._12_4_ = 0xffffffff;
            auVar45 = (auVar40 | auVar38 & auVar37) ^ auVar45;
            auVar37 = packssdw(auVar45,auVar45);
            if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar10[6].a[0].zName + lVar22 + 4) = 0;
            }
            lVar21 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 8;
            auVar33._8_8_ = lVar21 + 8;
            lVar21 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 8;
            auVar34._8_8_ = lVar21 + 8;
            lVar21 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 8;
            auVar35._8_8_ = lVar21 + 8;
            lVar21 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 8;
            auVar36._8_8_ = lVar21 + 8;
            lVar22 = lVar22 + 0x100;
          } while ((ulong)(iVar7 + 7U >> 3) << 8 != lVar22);
        }
        p->pOrderBy = pEVar10;
        local_88->pOrderBy = (ExprList *)0x0;
      }
      pEVar18 = local_88->pWhere;
      local_88->pWhere = (Expr *)0x0;
      if ((bVar2 & 0x20) != 0) {
        setJoinExpr(pEVar18,iVar27);
      }
      pEVar18 = sqlite3ExprAnd(pParse,pEVar18,p->pWhere);
      p->pWhere = pEVar18;
      if (db->mallocFailed == '\0') {
        local_50.pEList = local_88->pEList;
        local_50.pParse = pParse;
        local_50.iTable = iVar4;
        local_50.iNewTable = iVar27;
        local_50.isLeftJoin = iVar26;
        substSelect(&local_50,p,0);
      }
      p->selFlags = p->selFlags | local_88->selFlags & 0x100;
      if (local_88->pLimit != (Expr *)0x0) {
        p->pLimit = local_88->pLimit;
        local_88->pLimit = (Expr *)0x0;
      }
      p = p->pPrior;
      local_88 = local_88->pPrior;
    } while (p != (Select *)0x0);
  }
  if (pSVar28 != (Select *)0x0) {
    clearSelect(db,pSVar28,1);
  }
  return 1;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isLeftJoin = 0; /* True if pSub is the right side of a LEFT JOIN */    
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  struct SrcList_item *pSubitem;   /* The subquery */
  sqlite3 *db = pParse->db;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  pSub = pSubitem->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** If the subquery is the right operand of a LEFT JOIN, then the outer
  ** query cannot be an aggregate. (3c)  This is an artifact of the way
  ** aggregates are processed - there is no mechanism to determine if
  ** the LEFT JOIN table should be all-NULL.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & JT_OUTER)!=0 ){
    isLeftJoin = 1;
    if( pSubSrc->nSrc>1 || isAgg || IsVirtual(pSubSrc->a[0].pTab) ){
      /*  (3a)             (3c)     (3b) */
      return 0;
    }
  }
#ifdef SQLITE_EXTRA_IFNULLROW
  else if( iFrom>0 && !isAgg ){
    /* Setting isLeftJoin to -1 causes OP_IfNullRow opcodes to be generated for
    ** every reference to any result column from subquery in a join, even
    ** though they are not necessary.  This will stress-test the OP_IfNullRow 
    ** opcode. */
    isLeftJoin = -1;
  }
#endif

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || pSrc->nSrc!=1 ){
      return 0; /* (17d1), (17d2), or (17d3) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
      ){
        return 0;
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      int ii;
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }
  }

  /* Ex-restriction (23):
  ** The only way that the recursive part of a CTE can contain a compound
  ** subquery is for the subquery to be one term of a join.  But if the
  ** subquery is a join, then the flattening has already been stopped by
  ** restriction (17d3)
  */
  assert( (p->selFlags & SF_Recursive)==0 || pSub->pPrior==0 );

  /***** If we reach this point, flattening is permitted. *****/
  SELECTTRACE(1,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must 
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause> 
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or 
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    p->pOrderBy = 0;
    p->pSrc = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->pSrc = pSrc;
    p->op = TK_ALL;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      SELECTTRACE(2,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    if( db->mallocFailed ) return 1;
  }

  /* Begin flattening the iFrom-th entry of the FROM clause 
  ** in the outer query.
  */
  pSub = pSub1 = pSubitem->pSelect;

  /* Delete the transient table structure associated with the
  ** subquery
  */
  sqlite3DbFree(db, pSubitem->zDatabase);
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zDatabase = 0;
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  pSubitem->pSelect = 0;

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pTab!=0) ){
    Table *pTabToDel = pSubitem->pTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      pTabToDel->pNextZombie = pToplevel->pZombieTab;
      pToplevel->pZombieTab = pTabToDel;
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pSrc ){
      assert( pParent==p );  /* First time through the loop */
      jointype = pSubitem->fg.jointype;
    }else{
      assert( pParent!=p );  /* 2nd and subsequent times through the loop */
      pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    for(i=0; i<nSubSrc; i++){
      sqlite3IdListDelete(db, pSrc->a[i+iFrom].pUsing);
      assert( pSrc->a[i+iFrom].fg.isTabFunc==0 );
      pSrc->a[i+iFrom] = pSubSrc->a[i];
      iNewParent = pSubSrc->a[i].iCursor;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype = jointype;
  
    /* Now begin substituting subquery result set expressions for 
    ** references to the iParent in the outer query.
    ** 
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transfering the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isLeftJoin>0 ){
      setJoinExpr(pWhere, iNewParent);
    }
    pParent->pWhere = sqlite3ExprAnd(pParse, pWhere, pParent->pWhere);
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isLeftJoin = isLeftJoin;
      x.pEList = pSub->pEList;
      substSelect(&x, pParent, 0);
    }
  
    /* The flattened query is a compound if either the inner or the
    ** outer query is a compound. */
    pParent->selFlags |= pSub->selFlags & SF_Compound;
    assert( (pSub->selFlags & SF_Distinct)==0 ); /* restriction (17b) */
  
    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }
  }

  /* Finially, delete what is left of the subquery and return
  ** success.
  */
  sqlite3SelectDelete(db, pSub1);

#if SELECTTRACE_ENABLED
  if( sqlite3SelectTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}